

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O2

void nn_binproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_ctx **self_00;
  int iVar1;
  nn_list_item *it;
  nn_list_item *pnVar2;
  nn_sinproc *self_01;
  
  if (type == -3 && src == -2) {
    nn_ins_unbind((nn_ins_item *)&self[1].shutdown_fn);
    self_00 = &self[1].ctx;
    it = nn_list_begin((nn_list *)self_00);
    while( true ) {
      pnVar2 = nn_list_end((nn_list *)self_00);
      if (it == pnVar2) break;
      self_01 = (nn_sinproc *)(it + -0x28);
      if (it == (nn_list_item *)0x0) {
        self_01 = (nn_sinproc *)0x0;
      }
      nn_sinproc_stop(self_01);
      it = nn_list_next((nn_list *)self_00,it);
    }
    *(undefined4 *)&self[1].fn = 3;
LAB_0012b5e2:
    iVar1 = nn_list_empty((nn_list *)&self[1].ctx);
    if (iVar1 != 0) {
      *(undefined4 *)&self[1].fn = 1;
      nn_fsm_stopped_noevent(self);
      nn_ep_stopped((nn_ep *)self[1].srcptr);
      return;
    }
    return;
  }
  if (*(int *)&self[1].fn == 3) {
    if ((src == 1) && (type == 7)) {
      nn_list_erase((nn_list *)&self[1].ctx,(nn_list_item *)((long)srcptr + 0x280));
      nn_sinproc_term((nn_sinproc *)srcptr);
      nn_free(srcptr);
      goto LAB_0012b5e2;
    }
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "src == NN_BINPROC_SRC_SINPROC && type == NN_SINPROC_STOPPED",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
            ,0xa2);
  }
  else {
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
            ,0xb0);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_binproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_binproc *binproc;
    struct nn_list_item *it;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {

        /*  First, unregister the endpoint from the global repository of inproc
            endpoints. This way, new connections cannot be created anymore. */
        nn_ins_unbind (&binproc->item);

        /*  Stop the existing connections. */
        for (it = nn_list_begin (&binproc->sinprocs);
              it != nn_list_end (&binproc->sinprocs);
              it = nn_list_next (&binproc->sinprocs, it)) {
            sinproc = nn_cont (it, struct nn_sinproc, item);
            nn_sinproc_stop (sinproc);
        }

        binproc->state = NN_BINPROC_STATE_STOPPING;
        goto finish;
    }
    if (binproc->state == NN_BINPROC_STATE_STOPPING) {
        nn_assert (src == NN_BINPROC_SRC_SINPROC && type == NN_SINPROC_STOPPED);
        sinproc = (struct nn_sinproc*) srcptr;
        nn_list_erase (&binproc->sinprocs, &sinproc->item);
        nn_sinproc_term (sinproc);
        nn_free (sinproc);
finish:
        if (!nn_list_empty (&binproc->sinprocs))
            return;
        binproc->state = NN_BINPROC_STATE_IDLE;
        nn_fsm_stopped_noevent (&binproc->fsm);
        nn_ep_stopped (binproc->item.ep);
        return;
    }

    nn_fsm_bad_state(binproc->state, src, type);
}